

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.hxx
# Opt level: O0

void lineage::saveSolution(string *fileName,Solution *solution)

{
  size_type sVar1;
  byte *pbVar2;
  void *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  undefined8 in_RDI;
  size_t j;
  ofstream file;
  ulong local_218;
  undefined1 local_210 [512];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_10;
  
  local_10 = in_RSI;
  std::ofstream::ofstream(local_210,in_RDI,0x10);
  local_218 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_10);
    if (sVar1 <= local_218) break;
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_10,local_218);
    this = (void *)std::ostream::operator<<(local_210,(ulong)*pbVar2);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_218 = local_218 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

inline
void saveSolution(std::string const& fileName, Solution const& solution)
{
    std::ofstream file(fileName);

    for (size_t j = 0; j < solution.edge_labels.size(); ++j)
        file << static_cast<size_t>(solution.edge_labels[j]) << std::endl;
    
    file.close();
}